

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_file_priority
          (torrent *this,storage_error *err,vector<download_priority_t,_file_index_t> *prios)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  _Rb_tree_header *p_Var3;
  byte bVar4;
  uint uVar5;
  pointer psVar6;
  int iVar7;
  int iVar8;
  pointer psVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  pointer psVar12;
  map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  *__range3;
  vector<download_priority_t,_file_index_t> new_priority;
  undefined1 local_88 [32];
  undefined1 local_68 [24];
  _Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
  _Stack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  this->field_0x606 = this->field_0x606 & 0xdf;
  psVar9 = (this->m_file_priority).
           super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->m_file_priority).
           super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar12 = (prios->
            super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ).
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)psVar6 - (long)psVar9 ==
      (long)(prios->
            super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ).
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar12) {
    for (; psVar9 != psVar6; psVar9 = psVar9 + 1) {
      if (psVar9->m_val != psVar12->m_val) goto LAB_0031e31e;
      psVar12 = psVar12 + 1;
    }
  }
  else {
LAB_0031e31e:
    update_piece_priorities(this,prios);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::_M_move_assign(&(this->m_file_priority).
                      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ,prios);
    bVar4 = (this->m_need_save_resume_data).m_val;
    if ((bVar4 & 0x20) == 0) {
      (this->m_need_save_resume_data).m_val = bVar4 | 0x20;
      state_updated(this);
    }
    if (((this->super_torrent_hot_members).field_0x4b & 0x20) != 0) {
      recalc_share_mode(this);
    }
  }
  iVar8 = (err->ec).val_;
  iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  uVar5 = *(uint *)(CONCAT44(extraout_var,iVar7) + 0x68);
  if (iVar8 == 0) {
    if ((uVar5 & 8) != 0) {
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_88);
      alert_manager::emplace_alert<libtorrent::file_prio_alert,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_01,iVar8),(torrent_handle *)local_88);
      if ((piece_picker *)local_88._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          iVar8 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar8 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar8 + -1;
        }
        if (iVar8 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_88._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
    }
    if (((this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
       && (((this->super_torrent_hot_members).field_0x4b & 4) == 0)) {
      ::std::
      vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ::vector((vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                *)local_88,
               &(this->m_file_priority).
                super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              );
      p_Var3 = &(this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header;
      lVar10 = ::std::_Rb_tree_decrement(&p_Var3->_M_header);
      if ((int)(local_88._8_4_ - local_88._0_4_) <= *(int *)(lVar10 + 0x20)) {
        ::std::
        vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ::resize((vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  *)local_88,(long)*(int *)(lVar10 + 0x20) + 1,(value_type *)&default_priority);
      }
      for (p_Var11 = (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header
                     ._M_left; (_Rb_tree_header *)p_Var11 != p_Var3;
          p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11)) {
        *(undefined1 *)(local_88._0_8_ + (long)(int)p_Var11[1]._M_color) = p_Var11[1].field_0x4;
      }
      ::std::
      _Rb_tree<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::_Select1st<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::clear(&(this->m_deferred_file_priorities)._M_t);
      local_68._16_8_ = local_88._0_8_;
      _Stack_50.super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
           (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)
           (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_88._8_8_;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._16_8_;
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (piece_picker *)0x0;
      local_88._16_8_ = 0;
      prioritize_files(this,(vector<download_priority_t,_file_index_t> *)(local_68 + 0x10));
      if ((hash_picker *)local_68._16_8_ != (hash_picker *)0x0) {
        operator_delete((void *)local_68._16_8_,(long)local_48._M_pi - local_68._16_8_);
      }
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
      }
    }
  }
  else {
    if ((uVar5 & 0x49) != 0) {
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      resolve_filename_abi_cxx11_
                ((string *)local_88,this,(file_index_t)(int)*(int3 *)&err->field_0x10);
      get_handle((torrent *)local_68);
      alert_manager::
      emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar8),&err->ec,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &err->operation,(torrent_handle *)local_68);
      if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_68._8_8_ !=
          (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_68._8_8_ + 0xc);
          iVar8 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar8 = *(_Atomic_word *)(local_68._8_8_ + 0xc);
          *(int *)(local_68._8_8_ + 0xc) = iVar8 + -1;
        }
        if (iVar8 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    }
    set_error(this,&err->ec,(file_index_t)(int)*(int3 *)&err->field_0x10);
    pause(this);
  }
  return;
}

Assistant:

void torrent::on_file_priority(storage_error const& err
		, aux::vector<download_priority_t, file_index_t> prios)
	{
		m_outstanding_file_priority = false;
		COMPLETE_ASYNC("file_priority");

		if (m_file_priority != prios)
		{
			update_piece_priorities(prios);
			m_file_priority = std::move(prios);
			set_need_save_resume(torrent_handle::if_config_changed);
#ifndef TORRENT_DISABLE_SHARE_MODE
			if (m_share_mode)
				recalc_share_mode();
#endif
		}

		if (err)
		{
			// in this case, some file priorities failed to get set
			if (alerts().should_post<file_error_alert>())
				alerts().emplace_alert<file_error_alert>(err.ec
					, resolve_filename(err.file()), err.operation, get_handle());

			set_error(err.ec, err.file());
			pause();
			return;
		}

		if (alerts().should_post<file_prio_alert>())
			alerts().emplace_alert<file_prio_alert>(get_handle());

		if (!m_deferred_file_priorities.empty() && !m_abort)
		{
			auto new_priority = m_file_priority;
			// resize the vector if we have to. The last item in the map has the
			// highest file index.
			auto const max_idx = std::prev(m_deferred_file_priorities.end())->first;
			if (new_priority.end_index() <= max_idx)
			{
				// any unallocated slot is assumed to have the default priority
				new_priority.resize(static_cast<int>(max_idx) + 1, default_priority);
			}
			for (auto const& p : m_deferred_file_priorities)
			{
				file_index_t const index = p.first;
				download_priority_t const prio = p.second;
				new_priority[index] = prio;
			}
			m_deferred_file_priorities.clear();
			prioritize_files(std::move(new_priority));
		}
	}